

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

void * delete(hash_table_t *h,uint32 hash,char *key,size_t len)

{
  void *pvVar1;
  hash_entry_s *phVar2;
  int32 iVar3;
  hash_entry_t *phVar4;
  hash_entry_t *phVar5;
  hash_entry_t *entry;
  
  if (h->table[hash].key == (char *)0x0) {
    return (void *)0x0;
  }
  phVar5 = h->table + hash;
  if (h->nocase == 0) {
    phVar4 = (hash_entry_t *)0x0;
    while( true ) {
      entry = phVar5;
      if (entry == (hash_entry_t *)0x0) {
        return (void *)0x0;
      }
      if ((entry->len == len) && (iVar3 = keycmp_case(entry,key), iVar3 == 0)) break;
      phVar5 = entry->next;
      phVar4 = entry;
    }
  }
  else {
    phVar4 = (hash_entry_t *)0x0;
    while( true ) {
      entry = phVar5;
      if (entry == (hash_entry_t *)0x0) {
        return (void *)0x0;
      }
      if ((entry->len == len) && (iVar3 = keycmp_nocase(entry,key), iVar3 == 0)) break;
      phVar5 = entry->next;
      phVar4 = entry;
    }
  }
  pvVar1 = entry->val;
  phVar5 = entry->next;
  if (phVar4 == (hash_entry_t *)0x0) {
    if (phVar5 == (hash_entry_t *)0x0) {
      entry->key = (char *)0x0;
      entry->len = 0;
      goto LAB_00121909;
    }
    entry->key = phVar5->key;
    entry->len = phVar5->len;
    phVar2 = phVar5->next;
    entry->val = phVar5->val;
    entry->next = phVar2;
  }
  else {
    phVar4->next = phVar5;
    phVar5 = entry;
  }
  ckd_free(phVar5);
LAB_00121909:
  h->inuse = h->inuse + -1;
  return pvVar1;
}

Assistant:

static void *
delete(hash_table_t * h, uint32 hash, const char *key, size_t len)
{
    hash_entry_t *entry, *prev;
    void *val;

    prev = NULL;
    entry = &(h->table[hash]);
    if (entry->key == NULL)
        return NULL;

    if (h->nocase) {
        while (entry && ((entry->len != len)
                         || (keycmp_nocase(entry, key) != 0))) {
            prev = entry;
            entry = entry->next;
        }
    }
    else {
        while (entry && ((entry->len != len)
                         || (keycmp_case(entry, key) != 0))) {
            prev = entry;
            entry = entry->next;
        }
    }

    if (entry == NULL)
        return NULL;

    /* At this point, entry will be the one required to be deleted, prev
       will contain the previous entry
     */
    val = entry->val;

    if (prev == NULL) {
        /* That is to say the entry in the hash table (not the chain) matched the key. */
        /* We will then copy the things from the next entry to the hash table */
        prev = entry;
        if (entry->next) {      /* There is a next entry, great, copy it. */
            entry = entry->next;
            prev->key = entry->key;
            prev->len = entry->len;
            prev->val = entry->val;
            prev->next = entry->next;
            ckd_free(entry);
        }
        else {                  /* There is not a next entry, just set the key to null */
            prev->key = NULL;
            prev->len = 0;
            prev->next = NULL;
        }

    }
    else {                      /* This case is simple */
        prev->next = entry->next;
        ckd_free(entry);
    }

    /* Do wiring and free the entry */

    --h->inuse;

    return val;
}